

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlAutomataStatePtr xmlAutomataNewState(xmlAutomataPtr am)

{
  xmlRegStatePtr state;
  
  if (am == (xmlAutomataPtr)0x0) {
    state = (xmlAutomataStatePtr)0x0;
  }
  else {
    state = (xmlRegStatePtr)(*xmlMalloc)(0x38);
    if (state == (xmlRegStatePtr)0x0) {
      xmlRegexpErrMemory(am,"allocating state");
      state = (xmlRegStatePtr)0x0;
    }
    else {
      state->type = 0;
      state->mark = XML_REGEXP_MARK_NORMAL;
      state->markd = XML_REGEXP_MARK_NORMAL;
      state->reached = XML_REGEXP_MARK_NORMAL;
      state->trans = (xmlRegTrans *)0x0;
      state->maxTransTo = 0;
      state->nbTransTo = 0;
      state->no = 0;
      state->maxTrans = 0;
      *(undefined8 *)&state->nbTrans = 0;
      state->transTo = (int *)0x0;
      state->type = XML_REGEXP_TRANS_STATE;
      state->mark = XML_REGEXP_MARK_NORMAL;
    }
    xmlRegStatePush(am,state);
  }
  return state;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewState(xmlAutomataPtr am) {
    xmlAutomataStatePtr to;

    if (am == NULL)
	return(NULL);
    to = xmlRegNewState(am);
    xmlRegStatePush(am, to);
    return(to);
}